

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::WriteRuleHashes(cmGlobalGenerator *this,string *pfile)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  cmGeneratedFileStream fout;
  cmGeneratedFileStream local_270;
  
  if ((this->RuleHashes)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    cmGeneratedFileStream::cmGeneratedFileStream(&local_270,(pfile->_M_dataplus)._M_p,false,None);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_270,"# Hashes of file build rules.\n",0x1e);
    p_Var2 = (this->RuleHashes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var3 = &(this->RuleHashes)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var2 != p_Var3) {
      do {
        std::ostream::write((char *)&local_270,(long)(p_Var2 + 2));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_270," ",1);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_270,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      } while ((_Rb_tree_header *)p_Var2 != p_Var3);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_270);
    return;
  }
  cmsys::SystemTools::RemoveFile(pfile);
  return;
}

Assistant:

void cmGlobalGenerator::FillExtensionToLanguageMap(const std::string& l,
                                                   cmMakefile* mf)
{
  std::string extensionsVar = std::string("CMAKE_") + std::string(l) +
    std::string("_SOURCE_FILE_EXTENSIONS");
  std::string exts = mf->GetSafeDefinition(extensionsVar);
  std::vector<std::string> extensionList;
  cmSystemTools::ExpandListArgument(exts, extensionList);
  for (std::vector<std::string>::iterator i = extensionList.begin();
       i != extensionList.end(); ++i) {
    this->ExtensionToLanguage[*i] = l;
  }
}